

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldst_helper.c
# Opt level: O1

void demap_tlb(SparcTLBEntry *tlb,target_ulong demap_addr,char *strmmu,CPUSPARCState_conflict1 *env1
              )

{
  SparcTLBEntry *tlb_00;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  switch((uint)(demap_addr >> 4) & 3) {
  case 0:
    lVar4 = 0x1298;
    break;
  case 1:
    lVar4 = 0x12a0;
    break;
  case 2:
    uVar3 = 0;
    goto LAB_00a4cf54;
  case 3:
    goto switchD_00a4cf3d_caseD_3;
  }
  uVar3 = (uint)*(undefined8 *)(strmmu + lVar4);
LAB_00a4cf54:
  lVar4 = 0;
  do {
    uVar1 = *(ulong *)((long)&tlb->tte + lVar4);
    if ((long)uVar1 < 0) {
      tlb_00 = (SparcTLBEntry *)((long)&tlb->tag + lVar4);
      if ((demap_addr & 0x40) == 0) {
        if (((tlb_00->tag ^ demap_addr) >> ((byte)(uVar1 >> 0x3d) & 3) * '\x03') >> 0xd == 0) {
          if ((uVar1 & 1) == 0) {
            uVar2 = (uint)tlb_00->tag;
            goto joined_r0x00a4cfbb;
          }
LAB_00a4cfbd:
          replace_tlb_entry(tlb_00,0,0,(CPUSPARCState_conflict1 *)strmmu);
        }
      }
      else if ((uVar1 & 1) == 0) {
        uVar2 = (uint)tlb_00->tag;
joined_r0x00a4cfbb:
        if (((uVar2 ^ uVar3) & 0x1fff) == 0) goto LAB_00a4cfbd;
      }
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x400);
switchD_00a4cf3d_caseD_3:
  return;
}

Assistant:

static void demap_tlb(SparcTLBEntry *tlb, target_ulong demap_addr,
                      const char *strmmu, CPUSPARCState *env1)
{
    unsigned int i;
    target_ulong mask;
    uint64_t context;

    int is_demap_context = (demap_addr >> 6) & 1;

    /* demap context */
    switch ((demap_addr >> 4) & 3) {
    case 0: /* primary */
        context = env1->dmmu.mmu_primary_context;
        break;
    case 1: /* secondary */
        context = env1->dmmu.mmu_secondary_context;
        break;
    case 2: /* nucleus */
        context = 0;
        break;
    case 3: /* reserved */
    default:
        return;
    }

    for (i = 0; i < 64; i++) {
        if (TTE_IS_VALID(tlb[i].tte)) {

            if (is_demap_context) {
                /* will remove non-global entries matching context value */
                if (TTE_IS_GLOBAL(tlb[i].tte) ||
                    !tlb_compare_context(&tlb[i], context)) {
                    continue;
                }
            } else {
                /* demap page
                   will remove any entry matching VA */
                mask = 0xffffffffffffe000ULL;
                mask <<= 3 * ((tlb[i].tte >> 61) & 3);

                if (!compare_masked(demap_addr, tlb[i].tag, mask)) {
                    continue;
                }

                /* entry should be global or matching context value */
                if (!TTE_IS_GLOBAL(tlb[i].tte) &&
                    !tlb_compare_context(&tlb[i], context)) {
                    continue;
                }
            }

            replace_tlb_entry(&tlb[i], 0, 0, env1);
#ifdef DEBUG_MMU
            DPRINTF_MMU("%s demap invalidated entry [%02u]\n", strmmu, i);
            dump_mmu(env1);
#endif
        }
    }
}